

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int imcomp_get_compressed_image_par(fitsfile *infptr,int *status)

{
  float fVar1;
  int iVar2;
  long local_f0;
  long maxtilelen;
  long expect_nrows;
  int colNum;
  int oldFormat;
  int doffset;
  int tstatus2;
  int tstatus;
  int ii;
  char value [71];
  char local_78 [8];
  char keyword [75];
  int *status_local;
  fitsfile *infptr_local;
  
  expect_nrows._4_4_ = 0;
  expect_nrows._0_4_ = 0;
  if (*status < 1) {
    iVar2 = ffgky(infptr,0x10,"ZCMPTYPE",&tstatus,(char *)0x0,status);
    if (iVar2 < 1) {
      infptr->Fptr->zcmptype[0] = '\0';
      strncat(infptr->Fptr->zcmptype,(char *)&tstatus,0xb);
      if (((((char)tstatus < 'R') || ('R' < (char)tstatus)) ||
          (iVar2 = strcmp((char *)&tstatus,"RICE_1"), iVar2 != 0)) &&
         ((((char)tstatus < 'R' || ('R' < (char)tstatus)) ||
          (iVar2 = strcmp((char *)&tstatus,"RICE_ONE"), iVar2 != 0)))) {
        if ((((char)tstatus < 'H') || ('H' < (char)tstatus)) ||
           (iVar2 = strcmp((char *)&tstatus,"HCOMPRESS_1"), iVar2 != 0)) {
          if ((((char)tstatus < 'G') || ('G' < (char)tstatus)) ||
             (iVar2 = strcmp((char *)&tstatus,"GZIP_1"), iVar2 != 0)) {
            if ((((char)tstatus < 'G') || ('G' < (char)tstatus)) ||
               (iVar2 = strcmp((char *)&tstatus,"GZIP_2"), iVar2 != 0)) {
              if ((((char)tstatus < 'B') || ('B' < (char)tstatus)) ||
                 (iVar2 = strcmp((char *)&tstatus,"BZIP2_1"), iVar2 != 0)) {
                if ((((char)tstatus < 'P') || ('P' < (char)tstatus)) ||
                   (iVar2 = strcmp((char *)&tstatus,"PLIO_1"), iVar2 != 0)) {
                  if ((((char)tstatus < 'N') || ('N' < (char)tstatus)) ||
                     (iVar2 = strcmp((char *)&tstatus,"NOCOMPRESS"), iVar2 != 0)) {
                    ffpmsg("Unknown image compression type:");
                    ffpmsg((char *)&tstatus);
                    *status = 0x19e;
                    return 0x19e;
                  }
                  infptr->Fptr->compress_type = -1;
                }
                else {
                  infptr->Fptr->compress_type = 0x1f;
                }
              }
              else {
                infptr->Fptr->compress_type = 0x33;
              }
            }
            else {
              infptr->Fptr->compress_type = 0x16;
            }
          }
          else {
            infptr->Fptr->compress_type = 0x15;
          }
        }
        else {
          infptr->Fptr->compress_type = 0x29;
        }
      }
      else {
        infptr->Fptr->compress_type = 0xb;
      }
      iVar2 = ffgky(infptr,0x1f,"ZBITPIX",&infptr->Fptr->zbitpix,(char *)0x0,status);
      if (iVar2 < 1) {
        doffset = 0;
        oldFormat = 0;
        if (((infptr->Fptr->zbitpix < 0) &&
            (iVar2 = ffgcno(infptr,0,"ZZERO",(int *)&expect_nrows,&doffset), iVar2 == 0xdb)) &&
           (iVar2 = ffgcno(infptr,0,"ZSCALE",(int *)&expect_nrows,&oldFormat), iVar2 == 0xdb)) {
          infptr->Fptr->quantize_level = 9999.0;
        }
        else {
          doffset = 0;
          iVar2 = ffgky(infptr,0x10,"ZQUANTIZ",&tstatus,(char *)0x0,&doffset);
          if (iVar2 < 1) {
            if ((((char)tstatus < 'N') || ('N' < (char)tstatus)) ||
               (iVar2 = strcmp((char *)&tstatus,"NONE"), iVar2 != 0)) {
              if ((((char)tstatus < 'S') || ('S' < (char)tstatus)) ||
                 (iVar2 = strcmp((char *)&tstatus,"SUBTRACTIVE_DITHER_1"), iVar2 != 0)) {
                if ((((char)tstatus < 'S') || ('S' < (char)tstatus)) ||
                   (iVar2 = strcmp((char *)&tstatus,"SUBTRACTIVE_DITHER_2"), iVar2 != 0)) {
                  if ((((char)tstatus < 'N') || ('N' < (char)tstatus)) ||
                     (iVar2 = strcmp((char *)&tstatus,"NO_DITHER"), iVar2 != 0)) {
                    infptr->Fptr->quantize_method = 0;
                  }
                  else {
                    infptr->Fptr->quantize_method = -1;
                  }
                }
                else {
                  infptr->Fptr->quantize_method = 2;
                }
              }
              else {
                infptr->Fptr->quantize_method = 1;
              }
            }
            else {
              infptr->Fptr->quantize_level = 9999.0;
            }
          }
          else {
            infptr->Fptr->quantize_method = 0;
            infptr->Fptr->quantize_level = 0.0;
          }
        }
        doffset = 0;
        iVar2 = ffgky(infptr,0x1f,"ZDITHER0",&colNum,(char *)0x0,&doffset);
        if (iVar2 < 1) {
          infptr->Fptr->dither_seed = colNum;
        }
        else {
          infptr->Fptr->dither_seed = 1;
        }
        iVar2 = ffgky(infptr,0x1f,"ZNAXIS",&infptr->Fptr->zndim,(char *)0x0,status);
        if (iVar2 < 1) {
          if (infptr->Fptr->zndim < 1) {
            ffpmsg("Compressed image has no data (ZNAXIS < 1)");
            *status = 0xd4;
            infptr_local._4_4_ = 0xd4;
          }
          else if (infptr->Fptr->zndim < 7) {
            maxtilelen = 1;
            local_f0 = 1;
            for (tstatus2 = 0; tstatus2 < infptr->Fptr->zndim; tstatus2 = tstatus2 + 1) {
              snprintf(local_78,0x4b,"ZNAXIS%d",(ulong)(tstatus2 + 1));
              ffgky(infptr,0x29,local_78,infptr->Fptr->znaxis + tstatus2,(char *)0x0,status);
              if (0 < *status) {
                ffpmsg("required ZNAXISn compression keyword not found");
                return *status;
              }
              snprintf(local_78,0x4b,"ZTILE%d",(ulong)(tstatus2 + 1));
              if (tstatus2 == 0) {
                infptr->Fptr->tilesize[0] = infptr->Fptr->znaxis[0];
              }
              else {
                infptr->Fptr->tilesize[tstatus2] = 1;
              }
              doffset = 0;
              ffgky(infptr,0x29,local_78,infptr->Fptr->tilesize + tstatus2,(char *)0x0,&doffset);
              if (infptr->Fptr->tilesize[tstatus2] == 0) {
                ffpmsg("invalid ZTILE value = 0 in compressed image");
                *status = 0x19e;
                return 0x19e;
              }
              maxtilelen = ((infptr->Fptr->znaxis[tstatus2] + -1) / infptr->Fptr->tilesize[tstatus2]
                           + 1) * maxtilelen;
              local_f0 = infptr->Fptr->tilesize[tstatus2] * local_f0;
            }
            if (maxtilelen == infptr->Fptr->numrows) {
              if (infptr->Fptr->compress_type == 0xb) {
                iVar2 = ffgky(infptr,0x1f,"ZVAL1",&infptr->Fptr->rice_blocksize,(char *)0x0,status);
                if (0 < iVar2) {
                  ffpmsg("required ZVAL1 compression keyword not found");
                  return *status;
                }
                doffset = 0;
                iVar2 = ffgky(infptr,0x10,"ZNAME2",&tstatus,(char *)0x0,&doffset);
                if (((iVar2 == 0) && ('M' < (char)tstatus)) &&
                   (((char)tstatus < 'O' &&
                    (iVar2 = strcmp((char *)&tstatus,"NOISEBIT"), iVar2 == 0)))) {
                  expect_nrows._4_4_ = 1;
                }
                doffset = 0;
                if ((expect_nrows._4_4_ != 0) ||
                   (iVar2 = ffgky(infptr,0x1f,"ZVAL2",&infptr->Fptr->rice_bytepix,(char *)0x0,
                                  &doffset), 0 < iVar2)) {
                  infptr->Fptr->rice_bytepix = 4;
                }
                if ((infptr->Fptr->rice_blocksize < 0x10) && (8 < infptr->Fptr->rice_bytepix)) {
                  doffset = infptr->Fptr->rice_bytepix;
                  infptr->Fptr->rice_bytepix = infptr->Fptr->rice_blocksize;
                  infptr->Fptr->rice_blocksize = doffset;
                }
              }
              else if (infptr->Fptr->compress_type == 0x29) {
                iVar2 = ffgky(infptr,0x2a,"ZVAL1",&infptr->Fptr->hcomp_scale,(char *)0x0,status);
                if (0 < iVar2) {
                  ffpmsg("required ZVAL1 compression keyword not found");
                  return *status;
                }
                doffset = 0;
                ffgky(infptr,0x1f,"ZVAL2",&infptr->Fptr->hcomp_smooth,(char *)0x0,&doffset);
              }
              infptr->Fptr->maxtilelen = local_f0;
              if ((infptr->Fptr->compress_type == 0xb) && (infptr->Fptr->rice_blocksize == 0)) {
                ffpmsg("Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)");
                *status = 0x19e;
                infptr_local._4_4_ = 0x19e;
              }
              else {
                iVar2 = imcomp_calc_max_elem
                                  (infptr->Fptr->compress_type,(int)local_f0,infptr->Fptr->zbitpix,
                                   infptr->Fptr->rice_blocksize);
                infptr->Fptr->maxelem = (long)iVar2;
                iVar2 = ffgcno(infptr,0,"COMPRESSED_DATA",&infptr->Fptr->cn_compressed,status);
                if (iVar2 < 1) {
                  ffpmrk();
                  doffset = 0;
                  ffgcno(infptr,0,"UNCOMPRESSED_DATA",&infptr->Fptr->cn_uncompressed,&doffset);
                  doffset = 0;
                  ffgcno(infptr,0,"GZIP_COMPRESSED_DATA",&infptr->Fptr->cn_gzip_data,&doffset);
                  doffset = 0;
                  iVar2 = ffgcno(infptr,0,"ZSCALE",&infptr->Fptr->cn_zscale,&doffset);
                  if (0 < iVar2) {
                    doffset = 0;
                    iVar2 = ffgky(infptr,0x52,"ZSCALE",&infptr->Fptr->zscale,(char *)0x0,&doffset);
                    if (iVar2 < 1) {
                      infptr->Fptr->cn_zscale = -1;
                    }
                  }
                  doffset = 0;
                  iVar2 = ffgcno(infptr,0,"ZZERO",&infptr->Fptr->cn_zzero,&doffset);
                  if (0 < iVar2) {
                    doffset = 0;
                    iVar2 = ffgky(infptr,0x52,"ZZERO",&infptr->Fptr->zzero,(char *)0x0,&doffset);
                    if (iVar2 < 1) {
                      infptr->Fptr->cn_zzero = -1;
                    }
                  }
                  doffset = 0;
                  iVar2 = ffgcno(infptr,0,"ZBLANK",&infptr->Fptr->cn_zblank,&doffset);
                  if (0 < iVar2) {
                    doffset = 0;
                    iVar2 = ffgky(infptr,0x1f,"ZBLANK",&infptr->Fptr->zblank,(char *)0x0,&doffset);
                    if (iVar2 < 1) {
                      infptr->Fptr->cn_zblank = -1;
                    }
                    else {
                      doffset = 0;
                      iVar2 = ffgky(infptr,0x1f,"BLANK",&infptr->Fptr->zblank,(char *)0x0,&doffset);
                      if (iVar2 < 1) {
                        infptr->Fptr->cn_zblank = -1;
                      }
                    }
                  }
                  doffset = 0;
                  iVar2 = ffgky(infptr,0x52,"BSCALE",&infptr->Fptr->cn_bscale,(char *)0x0,&doffset);
                  if (0 < iVar2) {
                    infptr->Fptr->cn_bscale = 1.0;
                  }
                  doffset = 0;
                  iVar2 = ffgky(infptr,0x52,"BZERO",&infptr->Fptr->cn_bzero,(char *)0x0,&doffset);
                  if (iVar2 < 1) {
                    infptr->Fptr->cn_actual_bzero = infptr->Fptr->cn_bzero;
                  }
                  else {
                    infptr->Fptr->cn_bzero = 0.0;
                    infptr->Fptr->cn_actual_bzero = 0.0;
                  }
                  fVar1 = infptr->Fptr->request_quantize_level;
                  if ((fVar1 != 0.0) || (NAN(fVar1))) {
                    infptr->Fptr->quantize_level = infptr->Fptr->request_quantize_level;
                  }
                  ffcmrk();
                  infptr_local._4_4_ = *status;
                }
                else {
                  ffpmsg("couldn\'t find COMPRESSED_DATA column (fits_get_compressed_img_par)");
                  *status = 0x19e;
                  infptr_local._4_4_ = 0x19e;
                }
              }
            }
            else {
              ffpmsg("number of table rows != the number of tiles in compressed image");
              *status = 0x19e;
              infptr_local._4_4_ = 0x19e;
            }
          }
          else {
            ffpmsg("Compressed image has too many dimensions");
            *status = 0xd4;
            infptr_local._4_4_ = 0xd4;
          }
        }
        else {
          ffpmsg("required ZNAXIS compression keyword not found");
          infptr_local._4_4_ = *status;
        }
      }
      else {
        ffpmsg("required ZBITPIX compression keyword not found");
        infptr_local._4_4_ = *status;
      }
    }
    else {
      ffpmsg("required ZCMPTYPE compression keyword not found in");
      ffpmsg(" imcomp_get_compressed_image_par");
      infptr_local._4_4_ = *status;
    }
  }
  else {
    infptr_local._4_4_ = *status;
  }
  return infptr_local._4_4_;
}

Assistant:

int imcomp_get_compressed_image_par(fitsfile *infptr, int *status)
 
/* 
    This routine reads keywords from a BINTABLE extension containing a
    compressed image.
*/
{
    char keyword[FLEN_KEYWORD];
    char value[FLEN_VALUE];
    int ii, tstatus, tstatus2, doffset, oldFormat=0, colNum=0;
    long expect_nrows, maxtilelen;

    if (*status > 0)
        return(*status);

    /* Copy relevant header keyword values to structure */
    if (ffgky (infptr, TSTRING, "ZCMPTYPE", value, NULL, status) > 0)
    {
        ffpmsg("required ZCMPTYPE compression keyword not found in");
        ffpmsg(" imcomp_get_compressed_image_par");
        return(*status);
    }

    (infptr->Fptr)->zcmptype[0] = '\0';
    strncat((infptr->Fptr)->zcmptype, value, 11);

    if (!FSTRCMP(value, "RICE_1") || !FSTRCMP(value, "RICE_ONE") )
        (infptr->Fptr)->compress_type = RICE_1;
    else if (!FSTRCMP(value, "HCOMPRESS_1") )
        (infptr->Fptr)->compress_type = HCOMPRESS_1;
    else if (!FSTRCMP(value, "GZIP_1") )
        (infptr->Fptr)->compress_type = GZIP_1;
    else if (!FSTRCMP(value, "GZIP_2") )
        (infptr->Fptr)->compress_type = GZIP_2;
    else if (!FSTRCMP(value, "BZIP2_1") )
        (infptr->Fptr)->compress_type = BZIP2_1;
    else if (!FSTRCMP(value, "PLIO_1") )
        (infptr->Fptr)->compress_type = PLIO_1;
    else if (!FSTRCMP(value, "NOCOMPRESS") )
        (infptr->Fptr)->compress_type = NOCOMPRESS;
    else
    {
        ffpmsg("Unknown image compression type:");
        ffpmsg(value);
	return (*status = DATA_DECOMPRESSION_ERR);
    }
    
    if (ffgky (infptr, TINT,  "ZBITPIX",  &(infptr->Fptr)->zbitpix,  
               NULL, status) > 0)
    {
        ffpmsg("required ZBITPIX compression keyword not found");
        return(*status);
    }

    /* If ZZERO and ZSCALE columns don't exist for floating-point types,
     assume there is NO quantization.  Treat exactly as if it had ZQUANTIZ='NONE'.
     This is true regardless of whether or not file has a ZQUANTIZ keyword. */
    tstatus=0;
    tstatus2=0;
    if ((infptr->Fptr->zbitpix < 0) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZZERO",&colNum,&tstatus)
	      == COL_NOT_FOUND) &&
       (fits_get_colnum(infptr,CASEINSEN,"ZSCALE",&colNum,&tstatus2)
	      == COL_NOT_FOUND)) {
	  (infptr->Fptr)->quantize_level = NO_QUANTIZE;
    }
    else {
       /* get the floating point to integer quantization type, if present. */
       /* FITS files produced before 2009 will not have this keyword */
       tstatus = 0;
       if (ffgky(infptr, TSTRING, "ZQUANTIZ", value, NULL, &tstatus) > 0)
       {
           (infptr->Fptr)->quantize_method = 0;
           (infptr->Fptr)->quantize_level = 0;
       } else {

           if (!FSTRCMP(value, "NONE") ) {
               (infptr->Fptr)->quantize_level = NO_QUANTIZE;
	  } else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_1") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_1;
           else if (!FSTRCMP(value, "SUBTRACTIVE_DITHER_2") )
               (infptr->Fptr)->quantize_method = SUBTRACTIVE_DITHER_2;
           else if (!FSTRCMP(value, "NO_DITHER") )
               (infptr->Fptr)->quantize_method = NO_DITHER;
           else
               (infptr->Fptr)->quantize_method = 0;
       }
    }

    /* get the floating point quantization dithering offset, if present. */
    /* FITS files produced before October 2009 will not have this keyword */
    tstatus = 0;
    if (ffgky(infptr, TINT, "ZDITHER0", &doffset, NULL, &tstatus) > 0)
    {
	/* by default start with 1st element of random sequence */
        (infptr->Fptr)->dither_seed = 1;  
    } else {
        (infptr->Fptr)->dither_seed = doffset;
    }

    if (ffgky (infptr,TINT, "ZNAXIS", &(infptr->Fptr)->zndim, NULL, status) > 0)
    {
        ffpmsg("required ZNAXIS compression keyword not found");
        return(*status);
    }

    if ((infptr->Fptr)->zndim < 1)
    {
        ffpmsg("Compressed image has no data (ZNAXIS < 1)");
	return (*status = BAD_NAXIS);
    }

    if ((infptr->Fptr)->zndim > MAX_COMPRESS_DIM)
    {
        ffpmsg("Compressed image has too many dimensions");
        return(*status = BAD_NAXIS);
    }

    expect_nrows = 1;
    maxtilelen = 1;
    for (ii = 0;  ii < (infptr->Fptr)->zndim;  ii++)
    {
        /* get image size */
        snprintf (keyword, FLEN_KEYWORD,"ZNAXIS%d", ii+1);
	ffgky (infptr, TLONG,keyword, &(infptr->Fptr)->znaxis[ii],NULL,status);

        if (*status > 0)
        {
            ffpmsg("required ZNAXISn compression keyword not found");
            return(*status);
        }

        /* get compression tile size */
	snprintf (keyword, FLEN_KEYWORD,"ZTILE%d", ii+1);

        /* set default tile size in case keywords are not present */
        if (ii == 0)
            (infptr->Fptr)->tilesize[0] = (infptr->Fptr)->znaxis[0];
        else
            (infptr->Fptr)->tilesize[ii] = 1;

        tstatus = 0;
	ffgky (infptr, TLONG, keyword, &(infptr->Fptr)->tilesize[ii], NULL, 
               &tstatus);
        if ((infptr->Fptr)->tilesize[ii] == 0)
        {
           ffpmsg("invalid ZTILE value = 0 in compressed image");
           return (*status = DATA_DECOMPRESSION_ERR);
        }
        expect_nrows *= (((infptr->Fptr)->znaxis[ii] - 1) / 
                  (infptr->Fptr)->tilesize[ii]+ 1);
        maxtilelen *= (infptr->Fptr)->tilesize[ii];
    }

    /* check number of rows */
    if (expect_nrows != (infptr->Fptr)->numrows)
    {
        ffpmsg(
        "number of table rows != the number of tiles in compressed image");
        return (*status = DATA_DECOMPRESSION_ERR);
    }

    /* read any algorithm specific parameters */
    if ((infptr->Fptr)->compress_type == RICE_1 )
    {
        if (ffgky(infptr, TINT,"ZVAL1", &(infptr->Fptr)->rice_blocksize,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        /* First check for very old files, where ZVAL2 wasn't yet designated
           for bytepix */
        if (!ffgky(infptr, TSTRING, "ZNAME2", value, NULL, &tstatus)
                && !FSTRCMP(value, "NOISEBIT"))
        {
            oldFormat = 1;
        }
                
        tstatus = 0;
        if (oldFormat || ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->rice_bytepix,
                  NULL, &tstatus) > 0)
        {
            (infptr->Fptr)->rice_bytepix = 4;  /* default value */
        }

        if ((infptr->Fptr)->rice_blocksize < 16 &&
	    (infptr->Fptr)->rice_bytepix > 8) {
	     /* values are reversed */
	     tstatus = (infptr->Fptr)->rice_bytepix;
	     (infptr->Fptr)->rice_bytepix = (infptr->Fptr)->rice_blocksize;
	     (infptr->Fptr)->rice_blocksize = tstatus;
        }
    } else if ((infptr->Fptr)->compress_type == HCOMPRESS_1 ) {

        if (ffgky(infptr, TFLOAT,"ZVAL1", &(infptr->Fptr)->hcomp_scale,
                  NULL, status) > 0)
        {
            ffpmsg("required ZVAL1 compression keyword not found");
            return(*status);
        }

        tstatus = 0;
        ffgky(infptr, TINT,"ZVAL2", &(infptr->Fptr)->hcomp_smooth,
                  NULL, &tstatus);
    }    

    /* store number of pixels in each compression tile, */
    /* and max size of the compressed tile buffer */
    (infptr->Fptr)->maxtilelen = maxtilelen;

    /* prevent possible divide by zero in imcomp_calc_max_elem */
    if ((infptr->Fptr)->compress_type == RICE_1 && 
        (infptr->Fptr)->rice_blocksize == 0)
    {
        ffpmsg("Invalid RICE_1 blocksize = 0  (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }
    (infptr->Fptr)->maxelem = 
           imcomp_calc_max_elem ((infptr->Fptr)->compress_type, maxtilelen, 
               (infptr->Fptr)->zbitpix, (infptr->Fptr)->rice_blocksize);

    /* Get Column numbers. */
    if (ffgcno(infptr, CASEINSEN, "COMPRESSED_DATA",
         &(infptr->Fptr)->cn_compressed, status) > 0)
    {
        ffpmsg("couldn't find COMPRESSED_DATA column (fits_get_compressed_img_par)");
        return(*status = DATA_DECOMPRESSION_ERR);
    }

    ffpmrk(); /* put mark on message stack; erase any messages after this */

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "UNCOMPRESSED_DATA",
          &(infptr->Fptr)->cn_uncompressed, &tstatus);

    tstatus = 0;
    ffgcno(infptr,CASEINSEN, "GZIP_COMPRESSED_DATA",
          &(infptr->Fptr)->cn_gzip_data, &tstatus);

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZSCALE", &(infptr->Fptr)->cn_zscale,
              &tstatus) > 0)
    {
        /* CMPSCALE column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZSCALE", &(infptr->Fptr)->zscale, NULL, 
                 &tstatus) <= 0)
            (infptr->Fptr)->cn_zscale = -1;  /* flag for a constant ZSCALE */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZZERO", &(infptr->Fptr)->cn_zzero,
               &tstatus) > 0)
    {
        /* CMPZERO column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TDOUBLE, "ZZERO", &(infptr->Fptr)->zzero, NULL, 
                  &tstatus) <= 0)
            (infptr->Fptr)->cn_zzero = -1;  /* flag for a constant ZZERO */
    }

    tstatus = 0;
    if (ffgcno(infptr, CASEINSEN, "ZBLANK", &(infptr->Fptr)->cn_zblank,
               &tstatus) > 0)
    {
        /* ZBLANK column doesn't exist; see if there is a keyword */
        tstatus = 0;
        if (ffgky(infptr, TINT, "ZBLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  {
            (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */

        } else {
           /* ZBLANK keyword doesn't exist; see if there is a BLANK keyword */
           tstatus = 0;
           if (ffgky(infptr, TINT, "BLANK", &(infptr->Fptr)->zblank, NULL,
                  &tstatus) <= 0)  
              (infptr->Fptr)->cn_zblank = -1;  /* flag for a constant ZBLANK */
        }
    }

    /* read the conventional BSCALE and BZERO scaling keywords, if present */
    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BSCALE", &(infptr->Fptr)->cn_bscale, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bscale = 1.0;
    }

    tstatus = 0;
    if (ffgky (infptr, TDOUBLE, "BZERO", &(infptr->Fptr)->cn_bzero, 
        NULL, &tstatus) > 0)
    {
        (infptr->Fptr)->cn_bzero = 0.0;
        (infptr->Fptr)->cn_actual_bzero = 0.0;
    } else {
        (infptr->Fptr)->cn_actual_bzero = (infptr->Fptr)->cn_bzero;
    }

    /* special case: the quantization level is not given by a keyword in  */
    /* the HDU header, so we have to explicitly copy the requested value */
    /* to the actual value */
    if ( (infptr->Fptr)->request_quantize_level != 0.)
        (infptr->Fptr)->quantize_level = (infptr->Fptr)->request_quantize_level;

    ffcmrk();  /* clear any spurious error messages, back to the mark */
    return (*status);
}